

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

QPDF_ERROR_CODE
qpdf_add_page_at(qpdf_data qpdf,qpdf_data newpage_qpdf,qpdf_oh newpage,QPDF_BOOL before,
                qpdf_oh refpage)

{
  QPDF_ERROR_CODE QVar1;
  QPDFObjectHandle ref;
  QPDFObjectHandle page;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  qpdf_oh_item_internal((qpdf_data)(local_48 + 0x10),(qpdf_oh)newpage_qpdf);
  qpdf_oh_item_internal((qpdf_data)local_48,(qpdf_oh)qpdf);
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x18);
  *(qpdf_data *)local_68._M_unused._0_8_ = (qpdf_data)(local_48 + 0x10);
  *(QPDF_BOOL *)((long)local_68._M_unused._0_8_ + 8) = before;
  *(qpdf_data *)((long)local_68._M_unused._0_8_ + 0x10) = (qpdf_data)local_48;
  pcStack_50 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1883:15)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1883:15)>
             ::_M_manager;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_add_page_at(
    qpdf_data qpdf, qpdf_data newpage_qpdf, qpdf_oh newpage, QPDF_BOOL before, qpdf_oh refpage)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_add_page_at");
    auto page = qpdf_oh_item_internal(newpage_qpdf, newpage);
    auto ref = qpdf_oh_item_internal(qpdf, refpage);
    return trap_errors(
        qpdf, [&page, before, &ref](qpdf_data q) { q->qpdf->addPageAt(page, before, ref); });
}